

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O2

void nn_streamhdr_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (type == -3 && src == -2) {
    nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
    *(undefined4 *)&self[1].fn = 7;
  }
  else if (*(uint *)&self[1].fn != 7) {
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
            ,0x85);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_timer_isidle((nn_timer *)&self[1].shutdown_fn);
  if (iVar1 != 0) {
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped(self,3);
    return;
  }
  return;
}

Assistant:

static void nn_streamhdr_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_streamhdr *streamhdr;

    streamhdr = nn_cont (self, struct nn_streamhdr, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&streamhdr->timer);
        streamhdr->state = NN_STREAMHDR_STATE_STOPPING;
    }
    if (nn_slow (streamhdr->state == NN_STREAMHDR_STATE_STOPPING)) {
        if (!nn_timer_isidle (&streamhdr->timer))
            return;
        streamhdr->state = NN_STREAMHDR_STATE_IDLE;
        nn_fsm_stopped (&streamhdr->fsm, NN_STREAMHDR_STOPPED);
        return;
    }

    nn_fsm_bad_state (streamhdr->state, src, type);
}